

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int getindex_aux(lua_State *L,lua_State *L1,char **pc)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  
  skip(pc);
  pcVar2 = *pc;
  *pc = pcVar2 + 1;
  cVar1 = *pcVar2;
  if (cVar1 == 'U') {
    iVar3 = getnum_aux(L,L1,pc);
    iVar3 = -0xf4628 - iVar3;
  }
  else {
    if (cVar1 != 'R') {
      if (cVar1 == 'G') {
        iVar3 = luaL_error(L,"deprecated index \'G\'");
        return iVar3;
      }
      *pc = pcVar2;
      iVar3 = getnum_aux(L,L1,pc);
      return iVar3;
    }
    iVar3 = -0xf4628;
  }
  return iVar3;
}

Assistant:

static int getindex_aux (lua_State *L, lua_State *L1, const char **pc) {
  skip(pc);
  switch (*(*pc)++) {
    case 'R': return LUA_REGISTRYINDEX;
    case 'G': return luaL_error(L, "deprecated index 'G'");
    case 'U': return lua_upvalueindex(getnum_aux(L, L1, pc));
    default: (*pc)--; return getnum_aux(L, L1, pc);
  }
}